

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

Select * __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::selectify(wasm::If__
          (void *this,If *iff)

{
  PassOptions *pPVar1;
  bool bVar2;
  Module *pMVar3;
  Builder local_468;
  FinalOptimizer *local_460;
  Select *select;
  EffectAnalyzer condition;
  EffectAnalyzer ifFalse;
  undefined1 local_188 [8];
  EffectAnalyzer ifTrue;
  If *iff_local;
  FinalOptimizer *this_local;
  
  if (iff->ifFalse == (Expression *)0x0) {
    this_local = (FinalOptimizer *)0x0;
  }
  else {
    bVar2 = Properties::canEmitSelectWithArms(iff->ifTrue,iff->ifFalse);
    if (bVar2) {
      ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      bVar2 = wasm::Type::operator==
                        (&iff->condition->type,
                         (BasicType *)
                         ((long)&ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count + 4));
      if (bVar2) {
        this_local = (FinalOptimizer *)0x0;
      }
      else {
        bVar2 = tooCostlyToRunUnconditionally
                          (*(PassOptions **)((long)this + 0xe0),iff->ifTrue,iff->ifFalse);
        if (bVar2) {
          this_local = (FinalOptimizer *)0x0;
        }
        else {
          pPVar1 = *(PassOptions **)((long)this + 0xe0);
          pMVar3 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                             ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
          EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_188,pPVar1,pMVar3,iff->ifTrue);
          bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_188);
          if (bVar2) {
            this_local = (FinalOptimizer *)0x0;
          }
          else {
            pPVar1 = *(PassOptions **)((long)this + 0xe0);
            pMVar3 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                               ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this
                               );
            EffectAnalyzer::EffectAnalyzer
                      ((EffectAnalyzer *)
                       &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       pPVar1,pMVar3,iff->ifFalse);
            bVar2 = EffectAnalyzer::hasSideEffects
                              ((EffectAnalyzer *)
                               &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
            if (bVar2) {
              this_local = (FinalOptimizer *)0x0;
            }
            else {
              pPVar1 = *(PassOptions **)((long)this + 0xe0);
              pMVar3 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                                 ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)
                                  this);
              EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)&select,pPVar1,pMVar3,iff->condition)
              ;
              bVar2 = EffectAnalyzer::invalidates
                                ((EffectAnalyzer *)&select,(EffectAnalyzer *)local_188);
              if ((bVar2) ||
                 (bVar2 = EffectAnalyzer::invalidates
                                    ((EffectAnalyzer *)&select,
                                     (EffectAnalyzer *)
                                     &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count), bVar2)) {
                this_local = (FinalOptimizer *)0x0;
              }
              else {
                pMVar3 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                                   ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)
                                    this);
                Builder::Builder(&local_468,pMVar3);
                local_460 = (FinalOptimizer *)
                            Builder::makeSelect(&local_468,iff->condition,iff->ifTrue,iff->ifFalse);
                bVar2 = wasm::Type::operator!=
                                  ((Type *)&(local_460->
                                            super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>
                                            ).
                                            super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>
                                            .stack,
                                   &(iff->super_SpecificExpression<(wasm::Expression::Id)2>).
                                    super_Expression.type);
                if (bVar2) {
                  *(undefined1 *)((long)this + 0xe9) = 1;
                }
                this_local = local_460;
              }
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&select);
            }
            EffectAnalyzer::~EffectAnalyzer
                      ((EffectAnalyzer *)
                       &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_188);
        }
      }
    }
    else {
      this_local = (FinalOptimizer *)0x0;
    }
  }
  return (Select *)this_local;
}

Assistant:

Select* selectify(If* iff) {
        // Only an if-else can be turned into a select.
        if (!iff->ifFalse) {
          return nullptr;
        }
        if (!Properties::canEmitSelectWithArms(iff->ifTrue, iff->ifFalse)) {
          return nullptr;
        }
        if (iff->condition->type == Type::unreachable) {
          // An if with an unreachable condition may nonetheless have a type
          // that is not unreachable,
          //
          // (if (result i32) (unreachable) ..)
          //
          // Turning such an if into a select would change the type of the
          // expression, which would require updating types further up. Avoid
          // that, leaving dead code elimination to that dedicated pass.
          return nullptr;
        }
        // This is always helpful for code size, but can be a tradeoff with
        // performance as we run both code paths. So when shrinking we always
        // try to do this, but otherwise must consider more carefully.
        if (tooCostlyToRunUnconditionally(
              passOptions, iff->ifTrue, iff->ifFalse)) {
          return nullptr;
        }
        // Check if side effects allow this: we need to execute the two arms
        // unconditionally, and also to make the condition run last.
        EffectAnalyzer ifTrue(passOptions, *getModule(), iff->ifTrue);
        if (ifTrue.hasSideEffects()) {
          return nullptr;
        }
        EffectAnalyzer ifFalse(passOptions, *getModule(), iff->ifFalse);
        if (ifFalse.hasSideEffects()) {
          return nullptr;
        }
        EffectAnalyzer condition(passOptions, *getModule(), iff->condition);
        if (condition.invalidates(ifTrue) || condition.invalidates(ifFalse)) {
          return nullptr;
        }
        auto* select = Builder(*getModule())
                         .makeSelect(iff->condition, iff->ifTrue, iff->ifFalse);
        if (select->type != iff->type) {
          // If the select is more refined than the if it replaces, we must
          // propagate that outwards.
          refinalize = true;
        }
        return select;
      }